

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O1

void __thiscall
google::
dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
::clear_no_resize(dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *this)

{
  pointer ppVar1;
  type tVar2;
  size_type sVar3;
  pointer ppVar4;
  ulong uVar5;
  ulong uVar6;
  size_type sVar7;
  float fVar8;
  pair<int,_int> pVar9;
  
  if ((this->num_elements != 0) && (sVar3 = this->num_buckets, sVar3 != 0)) {
    ppVar4 = this->table;
    sVar7 = 0;
    do {
      ppVar1 = ppVar4 + sVar7;
      ppVar1->first = 0;
      ppVar1->second = 0;
      tVar2 = (this->key_info).empty_key;
      pVar9.second = -tVar2.second;
      pVar9.first = -tVar2.first;
      ppVar4[sVar7] = pVar9;
      sVar7 = sVar7 + 1;
    } while (sVar3 != sVar7);
  }
  uVar6 = this->num_buckets;
  fVar8 = (this->settings).
          super_sh_hashtable_settings<std::pair<int,_int>,_TransparentHasher,_unsigned_long,_4>.
          enlarge_factor_ * (float)uVar6;
  uVar5 = (ulong)fVar8;
  (this->settings).
  super_sh_hashtable_settings<std::pair<int,_int>,_TransparentHasher,_unsigned_long,_4>.
  enlarge_threshold_ = (long)(fVar8 - 9.223372e+18) & (long)uVar5 >> 0x3f | uVar5;
  fVar8 = (float)uVar6 *
          (this->settings).
          super_sh_hashtable_settings<std::pair<int,_int>,_TransparentHasher,_unsigned_long,_4>.
          shrink_factor_;
  uVar6 = (ulong)fVar8;
  (this->settings).
  super_sh_hashtable_settings<std::pair<int,_int>,_TransparentHasher,_unsigned_long,_4>.
  shrink_threshold_ = (long)(fVar8 - 9.223372e+18) & (long)uVar6 >> 0x3f | uVar6;
  (this->settings).
  super_sh_hashtable_settings<std::pair<int,_int>,_TransparentHasher,_unsigned_long,_4>.
  consider_shrink_ = false;
  this->num_deleted = 0;
  this->num_elements = 0;
  return;
}

Assistant:

void clear_no_resize() {
    if (num_elements > 0) {
      assert(table);
      destroy_buckets(0, num_buckets);
      fill_range_with_empty(table, num_buckets);
    }
    // don't consider to shrink before another erase()
    settings.reset_thresholds(bucket_count());
    num_elements = 0;
    num_deleted = 0;
  }